

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

Aig_Man_t * Saig_Synchronize(Aig_Man_t *pAig1,Aig_Man_t *pAig2,int nWords,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Str_t *vSequence;
  void **__ptr;
  void **ppvVar3;
  Vec_Ptr_t *vSimInfo;
  Aig_Man_t *p0;
  Aig_Man_t *pAVar4;
  Aig_Man_t *p;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  Vec_Str_t *pVVar9;
  int iVar10;
  timespec ts;
  timespec local_68;
  Vec_Str_t *local_58;
  Aig_Man_t *local_50;
  int local_44;
  long local_40;
  Aig_Man_t *local_38;
  
  if (fVerbose != 0) {
    printf("Design 1: ");
    Aig_ManPrintStats(pAig1);
    printf("Design 2: ");
    Aig_ManPrintStats(pAig2);
  }
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_58 = Saig_SynchSequence(pAig1,nWords);
  if (local_58 == (Vec_Str_t *)0x0) {
    iVar2 = 0x974727;
    printf("Design 1: Synchronizing sequence is not found. ");
LAB_0066a850:
    if (fVerbose == 0) goto LAB_0066a8a5;
    Abc_Print(iVar2,"%s =","Time");
    iVar10 = 3;
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  }
  else {
    if (fVerbose != 0) {
      iVar2 = 0x974757;
      printf("Design 1: Synchronizing sequence of length %4d is found. ",
             (long)local_58->nSize / (long)pAig1->nTruePis & 0xffffffff,
             (long)local_58->nSize % (long)pAig1->nTruePis & 0xffffffff);
      goto LAB_0066a850;
    }
LAB_0066a8a5:
    putchar(10);
  }
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  vSequence = Saig_SynchSequence(pAig2,nWords);
  pVVar9 = local_58;
  if (vSequence == (Vec_Str_t *)0x0) {
    iVar2 = 0x9747e1;
    printf("Design 2: Synchronizing sequence is not found. ");
    pVVar9 = local_58;
LAB_0066a967:
    if (fVerbose != 0) {
      Abc_Print(iVar2,"%s =","Time");
      iVar10 = 3;
      iVar2 = clock_gettime(3,&local_68);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
      goto LAB_0066a9f0;
    }
  }
  else if (fVerbose != 0) {
    iVar2 = 0x974811;
    printf("Design 2: Synchronizing sequence of length %4d is found. ",
           (long)vSequence->nSize / (long)pAig2->nTruePis & 0xffffffff,
           (long)vSequence->nSize % (long)pAig2->nTruePis & 0xffffffff);
    goto LAB_0066a967;
  }
  putchar(10);
LAB_0066a9f0:
  if (pVVar9 == (Vec_Str_t *)0x0 || vSequence == (Vec_Str_t *)0x0) {
    puts("Quitting synchronization.");
    if (pVVar9 != (Vec_Str_t *)0x0) {
      if (pVVar9->pArray != (char *)0x0) {
        free(pVVar9->pArray);
        pVVar9->pArray = (char *)0x0;
      }
      free(pVVar9);
    }
    if (vSequence != (Vec_Str_t *)0x0) {
      if (vSequence->pArray != (char *)0x0) {
        free(vSequence->pArray);
        vSequence->pArray = (char *)0x0;
      }
      free(vSequence);
    }
    p = (Aig_Man_t *)0x0;
  }
  else {
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      local_40 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
      local_40 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_68.tv_sec * -1000000;
    }
    uVar1 = pAig1->vObjs->nSize;
    uVar8 = pAig2->vObjs->nSize;
    if ((int)uVar8 < (int)uVar1) {
      uVar8 = uVar1;
    }
    local_50 = pAig1;
    local_38 = pAig2;
    __ptr = (void **)malloc((long)(int)uVar8 * 0xc);
    if (0 < (int)uVar8) {
      ppvVar3 = __ptr + (int)uVar8;
      uVar7 = 0;
      do {
        __ptr[uVar7] = ppvVar3;
        uVar7 = uVar7 + 1;
        ppvVar3 = (void **)((long)ppvVar3 + 4);
      } while (uVar8 != uVar7);
    }
    vSimInfo = (Vec_Ptr_t *)malloc(0x10);
    pAVar4 = local_50;
    vSimInfo->nSize = uVar8;
    vSimInfo->nCap = uVar8;
    vSimInfo->pArray = __ptr;
    iVar2 = Saig_SynchSequenceRun(local_50,vSimInfo,local_58,1);
    if (iVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x274,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar2 = Saig_SynchSequenceRun(pAVar4,vSimInfo,vSequence,0);
    pAVar4 = local_38;
    if (iVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x276,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    local_44 = fVerbose;
    iVar2 = Saig_SynchSequenceRun(local_38,vSimInfo,vSequence,1);
    if (iVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x27a,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    p0 = Saig_ManDupInitZero(local_50);
    pAVar4 = Saig_ManDupInitZero(pAVar4);
    p = Saig_ManCreateMiter(p0,pAVar4,0);
    Aig_ManCleanup(p);
    Aig_ManStop(p0);
    Aig_ManStop(pAVar4);
    if (__ptr != (void **)0x0) {
      free(__ptr);
      vSimInfo->pArray = (void **)0x0;
    }
    free(vSimInfo);
    iVar2 = local_44;
    pVVar9 = local_58;
    if (local_58->pArray != (char *)0x0) {
      free(local_58->pArray);
      pVVar9->pArray = (char *)0x0;
    }
    free(pVVar9);
    pAVar4 = local_50;
    if (vSequence->pArray != (char *)0x0) {
      free(vSequence->pArray);
      vSequence->pArray = (char *)0x0;
    }
    free(vSequence);
    Aig_ManCleanMarkA(pAVar4);
    Aig_ManCleanMarkA(local_38);
    if (iVar2 != 0) {
      iVar2 = 0x97488b;
      printf("Miter of the synchronized designs is constructed.         ");
      Abc_Print(iVar2,"%s =","Time");
      iVar10 = 3;
      iVar2 = clock_gettime(3,&local_68);
      if (iVar2 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar5 + local_40) / 1000000.0);
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_Synchronize( Aig_Man_t * pAig1, Aig_Man_t * pAig2, int nWords, int fVerbose )
{
    Aig_Man_t * pAig1z, * pAig2z, * pMiter;
    Vec_Str_t * vSeq1, * vSeq2;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;
/*
    {
        unsigned u = Saig_SynchRandomTernary();
        unsigned w = Saig_SynchRandomTernary();
        unsigned x = Saig_SynchNot( u );
        unsigned y = Saig_SynchNot( w );
        unsigned z = Saig_SynchAnd( x, y );

        Extra_PrintBinary( stdout, &u, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &w, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &x, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &y, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &z, 32 );  printf( "\n" );
    }
*/
    // report statistics
    if ( fVerbose )
    {
        printf( "Design 1: " );
        Aig_ManPrintStats( pAig1 );
        printf( "Design 2: " );
        Aig_ManPrintStats( pAig2 );
    }

    // synchronize the first design
    clk = Abc_Clock();
    vSeq1 = Saig_SynchSequence( pAig1, nWords );
    if ( vSeq1 == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq1) / Saig_ManPiNum(pAig1) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // synchronize the first design
    clk = Abc_Clock();
    vSeq2 = Saig_SynchSequence( pAig2, nWords );
    if ( vSeq2 == NULL )
        printf( "Design 2: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 2: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq2) / Saig_ManPiNum(pAig2) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // quit if one of the designs cannot be synchronized
    if ( vSeq1 == NULL || vSeq2 == NULL )
    {
        printf( "Quitting synchronization.\n" );
        if ( vSeq1 ) Vec_StrFree( vSeq1 );
        if ( vSeq2 ) Vec_StrFree( vSeq2 );
        return NULL;
    }
    clk = Abc_Clock();
    vSimInfo = Vec_PtrAllocSimInfo( Abc_MaxInt( Aig_ManObjNumMax(pAig1), Aig_ManObjNumMax(pAig2) ), 1 );

    // process Design 1
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq1, 1 );
    assert( RetValue == 0 );
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq2, 0 );
    assert( RetValue == 0 );

    // process Design 2
    RetValue = Saig_SynchSequenceRun( pAig2, vSimInfo, vSeq2, 1 );
    assert( RetValue == 0 );

    // duplicate designs
    pAig1z = Saig_ManDupInitZero( pAig1 );
    pAig2z = Saig_ManDupInitZero( pAig2 );
    pMiter = Saig_ManCreateMiter( pAig1z, pAig2z, 0 );
    Aig_ManCleanup( pMiter );
    Aig_ManStop( pAig1z );
    Aig_ManStop( pAig2z );

    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSeq1 );
    Vec_StrFree( vSeq2 );
    Aig_ManCleanMarkA( pAig1 );
    Aig_ManCleanMarkA( pAig2 );

    if ( fVerbose )
    {
        printf( "Miter of the synchronized designs is constructed.         " );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return pMiter;
}